

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printThumbAddrModeRROperand(MCInst *MI,uint Op,SStream *O)

{
  _Bool _Var1;
  uint uVar2;
  SStream *O_00;
  MCOperand *op;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint RegNum;
  MCOperand *MO2;
  MCOperand *MO1;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  MCInst *in_stack_ffffffffffffffc0;
  MCInst *MI_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_fffffffffffffff0;
  
  O_00 = (SStream *)MCInst_getOperand(in_RDI,in_ESI);
  op = MCInst_getOperand(in_RDI,in_ESI + 1);
  _Var1 = MCOperand_isReg((MCOperand *)O_00);
  if (_Var1) {
    SStream_concat0((SStream *)in_stack_ffffffffffffffc0,
                    (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    set_mem_access(in_stack_ffffffffffffffc0,(_Bool)in_stack_ffffffffffffffbf);
    MI_00 = (MCInst *)in_RDI->csh;
    MCOperand_getReg((MCOperand *)O_00);
    printRegName((cs_struct *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDX,
                 (uint)((ulong)MI_00 >> 0x20));
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      uVar2 = MCOperand_getReg((MCOperand *)O_00);
      *(uint *)(in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar2;
    }
    uVar2 = MCOperand_getReg(op);
    if (uVar2 != 0) {
      SStream_concat0((SStream *)MI_00,
                      (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      printRegName((cs_struct *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),in_RDX,
                   (uint)((ulong)MI_00 >> 0x20));
      if (in_RDI->csh->detail != CS_OPT_OFF) {
        *(uint *)(in_RDI->flat_insn->detail->groups +
                 (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x49) = uVar2;
      }
    }
    SStream_concat0((SStream *)MI_00,
                    (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    set_mem_access(MI_00,(_Bool)in_stack_ffffffffffffffbf);
  }
  else {
    printOperand((MCInst *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(uint)((ulong)in_RDX >> 0x20),
                 O_00);
  }
  return;
}

Assistant:

static void printThumbAddrModeRROperand(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);
	MCOperand *MO2 = MCInst_getOperand(MI, Op + 1);
	unsigned RegNum;

	if (!MCOperand_isReg(MO1)) {   // FIXME: This is for CP entries, but isn't right.
		printOperand(MI, Op, O);
		return;
	}

	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	RegNum = MCOperand_getReg(MO2);
	if (RegNum) {
		SStream_concat0(O, ", ");
		printRegName(MI->csh, O, RegNum);
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.index = RegNum;
	}
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}